

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_compressBlock_btlazy2_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *pBVar1;
  uint uVar2;
  int iVar3;
  undefined8 uVar4;
  seqStore_t *psVar5;
  U32 lowestValid_1;
  uint uVar6;
  int iVar7;
  uint uVar8;
  size_t sVar9;
  U32 UVar10;
  uint uVar11;
  U32 UVar12;
  size_t sVar13;
  BYTE *pBVar14;
  U32 UVar15;
  ulong uVar16;
  BYTE *litEnd;
  BYTE *pBVar17;
  BYTE *pBVar18;
  BYTE *pBVar19;
  long lVar20;
  int *piVar21;
  U32 UVar22;
  int iVar23;
  int iVar24;
  seqDef *psVar25;
  int *piVar26;
  U32 maxDistance;
  size_t offsetFound;
  BYTE *litLimit_w;
  size_t local_a8;
  size_t local_98;
  U32 local_8c;
  BYTE *local_88;
  int *local_80;
  int *local_78;
  BYTE *local_70;
  BYTE *local_68;
  BYTE *local_60;
  BYTE *local_58;
  int *local_50;
  U32 *local_48;
  BYTE *local_40;
  seqStore_t *local_38;
  
  pBVar17 = (BYTE *)((long)src + srcSize);
  local_80 = (int *)((long)src + (srcSize - 8));
  local_60 = (ms->window).base;
  uVar2 = (ms->window).dictLimit;
  local_70 = local_60 + uVar2;
  UVar22 = *rep;
  UVar15 = rep[1];
  piVar26 = (int *)((ulong)(local_70 == (BYTE *)src) + (long)src);
  local_48 = rep;
  if (piVar26 < local_80) {
    local_68 = (ms->window).dictBase;
    local_58 = local_68 + uVar2;
    local_40 = local_68 + (ms->window).lowLimit;
    uVar6 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    iVar7 = uVar2 - 1;
    local_50 = (int *)(pBVar17 + -0x20);
    local_88 = pBVar17;
    local_38 = seqStore;
    do {
      iVar23 = (int)piVar26 - (int)local_60;
      iVar24 = iVar23 + 1;
      UVar12 = (ms->window).lowLimit;
      UVar10 = iVar24 - uVar6;
      if (iVar24 - UVar12 <= uVar6) {
        UVar10 = UVar12;
      }
      if (ms->loadedDictEnd != 0) {
        UVar10 = UVar12;
      }
      uVar8 = iVar24 - UVar22;
      pBVar18 = local_60;
      if (uVar8 < uVar2) {
        pBVar18 = local_68;
      }
      local_8c = UVar15;
      if (iVar7 - uVar8 < 3) {
LAB_001fada9:
        uVar16 = 0;
      }
      else {
        uVar16 = 0;
        if (UVar22 < (iVar23 - UVar10) + 1) {
          if (*(int *)((long)piVar26 + 1) != *(int *)(pBVar18 + uVar8)) goto LAB_001fada9;
          pBVar14 = pBVar17;
          if (uVar8 < uVar2) {
            pBVar14 = local_58;
          }
          sVar9 = ZSTD_count_2segments
                            ((BYTE *)((long)piVar26 + 5),(BYTE *)((long)(pBVar18 + uVar8) + 4),
                             pBVar17,pBVar14,local_70);
          uVar16 = sVar9 + 4;
        }
      }
      local_98 = 999999999;
      sVar9 = ZSTD_BtFindBestMatch_extDict_selectMLS(ms,(BYTE *)piVar26,pBVar17,&local_98);
      local_a8 = uVar16;
      if (uVar16 < sVar9) {
        local_a8 = sVar9;
      }
      if (local_a8 < 4) {
        piVar26 = (int *)((long)piVar26 + ((long)piVar26 - (long)src >> 8) + 1);
        UVar15 = local_8c;
      }
      else {
        local_78 = piVar26;
        sVar13 = local_98;
        if (sVar9 <= uVar16) {
          local_78 = (int *)((long)piVar26 + 1);
          sVar13 = 0;
        }
        if (piVar26 < local_80) {
          do {
            piVar21 = (int *)((long)piVar26 + 1);
            iVar24 = iVar23 + 1;
            if (sVar13 == 0) {
              sVar13 = 0;
            }
            else {
              UVar15 = (ms->window).lowLimit;
              UVar12 = iVar24 - uVar6;
              if (iVar24 - UVar15 <= uVar6) {
                UVar12 = UVar15;
              }
              if (ms->loadedDictEnd != 0) {
                UVar12 = UVar15;
              }
              uVar8 = iVar24 - UVar22;
              pBVar17 = local_60;
              if (uVar8 < uVar2) {
                pBVar17 = local_68;
              }
              if (((2 < iVar7 - uVar8) && (UVar22 < iVar24 - UVar12)) &&
                 (*piVar21 == *(int *)(pBVar17 + uVar8))) {
                pBVar18 = local_88;
                if (uVar8 < uVar2) {
                  pBVar18 = local_58;
                }
                sVar9 = ZSTD_count_2segments
                                  ((BYTE *)((long)piVar26 + 5),(BYTE *)((long)(pBVar17 + uVar8) + 4)
                                   ,local_88,pBVar18,local_70);
                if (sVar9 < 0xfffffffffffffffc) {
                  uVar11 = (int)sVar13 + 1;
                  uVar8 = 0x1f;
                  if (uVar11 != 0) {
                    for (; uVar11 >> uVar8 == 0; uVar8 = uVar8 - 1) {
                    }
                  }
                  if ((int)((uVar8 ^ 0x1f) + (int)local_a8 * 3 + -0x1e) < (int)(sVar9 + 4) * 3) {
                    sVar13 = 0;
                    local_a8 = sVar9 + 4;
                    local_78 = piVar21;
                  }
                }
              }
            }
            local_98 = 999999999;
            sVar9 = ZSTD_BtFindBestMatch_extDict_selectMLS(ms,(BYTE *)piVar21,local_88,&local_98);
            pBVar17 = local_88;
            if (sVar9 < 4) {
LAB_001faf4b:
              if (local_80 <= piVar21) break;
              piVar21 = (int *)((long)piVar26 + 2);
              iVar24 = iVar23 + 2;
              if (sVar13 == 0) {
                sVar13 = 0;
              }
              else {
                UVar15 = (ms->window).lowLimit;
                UVar12 = iVar24 - uVar6;
                if (iVar24 - UVar15 <= uVar6) {
                  UVar12 = UVar15;
                }
                if (ms->loadedDictEnd != 0) {
                  UVar12 = UVar15;
                }
                uVar8 = iVar24 - UVar22;
                pBVar18 = local_60;
                if (uVar8 < uVar2) {
                  pBVar18 = local_68;
                }
                if (((2 < iVar7 - uVar8) && (UVar22 < iVar24 - UVar12)) &&
                   (*piVar21 == *(int *)(pBVar18 + uVar8))) {
                  pBVar14 = local_88;
                  if (uVar8 < uVar2) {
                    pBVar14 = local_58;
                  }
                  sVar9 = ZSTD_count_2segments
                                    ((BYTE *)((long)piVar26 + 6),
                                     (BYTE *)((long)(pBVar18 + uVar8) + 4),local_88,pBVar14,local_70
                                    );
                  if (sVar9 < 0xfffffffffffffffc) {
                    uVar11 = (int)sVar13 + 1;
                    uVar8 = 0x1f;
                    if (uVar11 != 0) {
                      for (; uVar11 >> uVar8 == 0; uVar8 = uVar8 - 1) {
                      }
                    }
                    if ((int)((uVar8 ^ 0x1f) + (int)local_a8 * 4 + -0x1e) < (int)(sVar9 + 4) * 4) {
                      sVar13 = 0;
                      local_a8 = sVar9 + 4;
                      local_78 = piVar21;
                    }
                  }
                }
              }
              local_98 = 999999999;
              sVar9 = ZSTD_BtFindBestMatch_extDict_selectMLS(ms,(BYTE *)piVar21,pBVar17,&local_98);
              if (sVar9 < 4) break;
              uVar11 = (int)sVar13 + 1;
              uVar8 = 0x1f;
              if (uVar11 != 0) {
                for (; uVar11 >> uVar8 == 0; uVar8 = uVar8 - 1) {
                }
              }
              uVar11 = (int)local_98 + 1;
              iVar23 = 0x1f;
              if (uVar11 != 0) {
                for (; uVar11 >> iVar23 == 0; iVar23 = iVar23 + -1) {
                }
              }
              if ((int)sVar9 * 4 - iVar23 <= (int)((uVar8 ^ 0x1f) + (int)local_a8 * 4 + -0x18))
              break;
            }
            else {
              uVar11 = (int)sVar13 + 1;
              uVar8 = 0x1f;
              if (uVar11 != 0) {
                for (; uVar11 >> uVar8 == 0; uVar8 = uVar8 - 1) {
                }
              }
              uVar11 = (int)local_98 + 1;
              iVar3 = 0x1f;
              if (uVar11 != 0) {
                for (; uVar11 >> iVar3 == 0; iVar3 = iVar3 + -1) {
                }
              }
              if ((int)sVar9 * 4 - iVar3 <= (int)((uVar8 ^ 0x1f) + (int)local_a8 * 4 + -0x1b))
              goto LAB_001faf4b;
            }
            iVar23 = iVar24;
            sVar13 = local_98;
            piVar26 = piVar21;
            local_a8 = sVar9;
            local_78 = piVar21;
          } while (piVar21 < local_80);
        }
        psVar5 = local_38;
        pBVar17 = local_88;
        piVar26 = local_78;
        if (sVar13 == 0) {
          UVar12 = 1;
          UVar15 = UVar22;
        }
        else {
          pBVar19 = (BYTE *)((long)local_78 + (2 - (long)(local_60 + sVar13)));
          pBVar14 = local_70;
          pBVar18 = local_60;
          if ((uint)pBVar19 < uVar2) {
            pBVar14 = local_40;
            pBVar18 = local_68;
          }
          if ((src < local_78) && (uVar16 = (ulong)pBVar19 & 0xffffffff, pBVar14 < pBVar18 + uVar16)
             ) {
            pBVar18 = pBVar18 + uVar16;
            do {
              pBVar18 = pBVar18 + -1;
              piVar21 = (int *)((long)piVar26 + -1);
              if ((*(BYTE *)piVar21 != *pBVar18) ||
                 (local_a8 = local_a8 + 1, piVar26 = piVar21, piVar21 <= src)) break;
            } while (pBVar14 < pBVar18);
          }
          UVar12 = (int)sVar13 + 1;
          UVar15 = (int)sVar13 - 2;
          local_8c = UVar22;
        }
        UVar22 = UVar15;
        uVar16 = (long)piVar26 - (long)src;
        pBVar18 = local_38->lit;
        if (local_50 < piVar26) {
          piVar21 = (int *)src;
          pBVar14 = pBVar18;
          if (src <= local_50) {
            pBVar14 = pBVar18 + ((long)local_50 - (long)src);
            uVar4 = *(undefined8 *)((long)src + 8);
            *(undefined8 *)pBVar18 = *src;
            *(undefined8 *)(pBVar18 + 8) = uVar4;
            piVar21 = local_50;
            if (0x10 < (long)local_50 - (long)src) {
              lVar20 = 0x10;
              do {
                uVar4 = *(undefined8 *)((BYTE *)((long)src + lVar20) + 8);
                pBVar19 = pBVar18 + lVar20;
                *(undefined8 *)pBVar19 = *(undefined8 *)((long)src + lVar20);
                *(undefined8 *)(pBVar19 + 8) = uVar4;
                pBVar1 = (BYTE *)((long)src + lVar20 + 0x10);
                uVar4 = *(undefined8 *)(pBVar1 + 8);
                *(undefined8 *)(pBVar19 + 0x10) = *(undefined8 *)pBVar1;
                *(undefined8 *)(pBVar19 + 0x18) = uVar4;
                lVar20 = lVar20 + 0x20;
              } while (pBVar19 + 0x20 < pBVar14);
            }
          }
          if (piVar21 < piVar26) {
            lVar20 = 0;
            do {
              pBVar14[lVar20] = *(BYTE *)((long)piVar21 + lVar20);
              lVar20 = lVar20 + 1;
            } while ((long)piVar26 - (long)piVar21 != lVar20);
          }
LAB_001fb26b:
          local_38->lit = local_38->lit + uVar16;
          psVar25 = local_38->sequences;
          if (0xffff < uVar16) {
            local_38->longLengthType = ZSTD_llt_literalLength;
            local_38->longLengthPos =
                 (U32)((ulong)((long)psVar25 - (long)local_38->sequencesStart) >> 3);
          }
        }
        else {
          uVar4 = *(undefined8 *)((long)src + 8);
          *(undefined8 *)pBVar18 = *src;
          *(undefined8 *)(pBVar18 + 8) = uVar4;
          pBVar18 = local_38->lit;
          if (0x10 < uVar16) {
            uVar4 = *(undefined8 *)((long)src + 0x18);
            *(undefined8 *)(pBVar18 + 0x10) = *(undefined8 *)((long)src + 0x10);
            *(undefined8 *)(pBVar18 + 0x18) = uVar4;
            if (0x20 < (long)uVar16) {
              lVar20 = 0;
              do {
                pBVar19 = (BYTE *)((long)src + lVar20 + 0x20);
                uVar4 = *(undefined8 *)(pBVar19 + 8);
                pBVar14 = pBVar18 + lVar20 + 0x20;
                *(undefined8 *)pBVar14 = *(undefined8 *)pBVar19;
                *(undefined8 *)(pBVar14 + 8) = uVar4;
                pBVar19 = (BYTE *)((long)src + lVar20 + 0x30);
                uVar4 = *(undefined8 *)(pBVar19 + 8);
                *(undefined8 *)(pBVar14 + 0x10) = *(undefined8 *)pBVar19;
                *(undefined8 *)(pBVar14 + 0x18) = uVar4;
                lVar20 = lVar20 + 0x20;
              } while (pBVar14 + 0x20 < pBVar18 + uVar16);
            }
            goto LAB_001fb26b;
          }
          local_38->lit = pBVar18 + uVar16;
          psVar25 = local_38->sequences;
        }
        psVar25->litLength = (U16)uVar16;
        psVar25->offset = UVar12;
        if (0xffff < local_a8 - 3) {
          local_38->longLengthType = ZSTD_llt_matchLength;
          local_38->longLengthPos =
               (U32)((ulong)((long)psVar25 - (long)local_38->sequencesStart) >> 3);
        }
        psVar25->matchLength = (U16)(local_a8 - 3);
        psVar25 = psVar25 + 1;
        local_38->sequences = psVar25;
        piVar26 = (int *)((long)piVar26 + local_a8);
        src = piVar26;
        UVar15 = local_8c;
        UVar12 = UVar22;
        if (piVar26 <= local_80) {
          do {
            uVar8 = UVar15;
            iVar24 = (int)piVar26 - (int)local_60;
            UVar22 = (ms->window).lowLimit;
            UVar10 = iVar24 - uVar6;
            if (iVar24 - UVar22 <= uVar6) {
              UVar10 = UVar22;
            }
            if (ms->loadedDictEnd != 0) {
              UVar10 = UVar22;
            }
            uVar11 = iVar24 - uVar8;
            pBVar18 = local_60;
            if (uVar11 < uVar2) {
              pBVar18 = local_68;
            }
            src = piVar26;
            UVar22 = UVar12;
            UVar15 = uVar8;
            if (((iVar7 - uVar11 < 3) || (iVar24 - UVar10 <= uVar8)) ||
               (*piVar26 != *(int *)(pBVar18 + uVar11))) break;
            pBVar14 = pBVar17;
            if (uVar11 < uVar2) {
              pBVar14 = local_58;
            }
            sVar9 = ZSTD_count_2segments
                              ((BYTE *)(piVar26 + 1),(BYTE *)((long)(pBVar18 + uVar11) + 4),pBVar17,
                               pBVar14,local_70);
            if (piVar26 <= local_50) {
              pBVar18 = psVar5->lit;
              uVar4 = *(undefined8 *)(piVar26 + 2);
              *(undefined8 *)pBVar18 = *(undefined8 *)piVar26;
              *(undefined8 *)(pBVar18 + 8) = uVar4;
              psVar25 = psVar5->sequences;
            }
            psVar25->litLength = 0;
            psVar25->offset = 1;
            if (0xffff < sVar9 + 1) {
              psVar5->longLengthType = ZSTD_llt_matchLength;
              psVar5->longLengthPos =
                   (U32)((ulong)((long)psVar25 - (long)psVar5->sequencesStart) >> 3);
            }
            psVar25->matchLength = (U16)(sVar9 + 1);
            psVar25 = psVar25 + 1;
            psVar5->sequences = psVar25;
            piVar26 = (int *)((long)piVar26 + sVar9 + 4);
            src = piVar26;
            UVar22 = uVar8;
            UVar15 = UVar12;
            UVar12 = uVar8;
          } while (piVar26 <= local_80);
        }
      }
    } while (piVar26 < local_80);
  }
  *local_48 = UVar22;
  local_48[1] = UVar15;
  return (long)pBVar17 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_btlazy2_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_binaryTree, 2);
}